

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HandleManager.cpp
# Opt level: O0

bool helics::interfaceTypeMatch(InterfaceType given,InterfaceType expected)

{
  bool local_5;
  InterfaceType expected_local;
  InterfaceType given_local;
  bool local_1;
  
  if (given == expected) {
    local_1 = true;
  }
  else if ((expected == ENDPOINT) || (expected == INPUT)) {
    local_5 = given == TRANSLATOR || given == SINK;
    local_1 = local_5;
  }
  else if (expected == PUBLICATION) {
    local_1 = given == TRANSLATOR;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

static bool interfaceTypeMatch(InterfaceType given, InterfaceType expected)
{
    if (given == expected) {
        return true;
    }
    switch (expected) {
        case InterfaceType::PUBLICATION:
            return (given == InterfaceType::TRANSLATOR);
        case InterfaceType::INPUT:
        case InterfaceType::ENDPOINT:
            return (given == InterfaceType::TRANSLATOR || given == InterfaceType::SINK);
        default:
            break;
    }
    return false;
}